

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetHostname(SystemInformationImplementation *this)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  undefined1 local_196 [2];
  int errorFlag;
  utsname unameInfo;
  SystemInformationImplementation *this_local;
  
  unameInfo.domainname._57_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&this->Hostname,"localhost");
    iVar3 = uname((utsname *)local_196);
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)&this->Hostname,unameInfo.sysname + 0x39);
    }
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char* SystemInformationImplementation::GetHostname()
{
  if (this->Hostname.empty())
    {
    this->Hostname="localhost";
#if defined(_WIN32)
    WORD wVersionRequested;
    WSADATA wsaData;
    char name[255];
    wVersionRequested = MAKEWORD(2,0);
    if ( WSAStartup( wVersionRequested, &wsaData ) == 0 )
      {
      gethostname(name,sizeof(name));
      WSACleanup( );
      }
    this->Hostname = name;
#else
    struct utsname unameInfo;
    int errorFlag = uname(&unameInfo);
    if(errorFlag == 0)
      {
      this->Hostname = unameInfo.nodename;
      }
#endif
    }
  return this->Hostname.c_str();
}